

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

StructUnionTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructUnionTypeSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::StructUnionMemberSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,Token *args_3,
          Token *args_4,Token *args_5,SyntaxList<slang::syntax::StructUnionMemberSyntax> *args_6,
          Token *args_7,SyntaxList<slang::syntax::VariableDimensionSyntax> *args_8)

{
  Token keyword;
  Token tagged;
  Token packed;
  Token signing;
  Token openBrace;
  Token closeBrace;
  StructUnionTypeSyntax *this_00;
  
  this_00 = (StructUnionTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StructUnionTypeSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (StructUnionTypeSyntax *)allocateSlow(this,0xd0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  tagged.kind = args_2->kind;
  tagged._2_1_ = args_2->field_0x2;
  tagged.numFlags.raw = (args_2->numFlags).raw;
  tagged.rawLen = args_2->rawLen;
  tagged.info = args_2->info;
  closeBrace.kind = args_7->kind;
  closeBrace._2_1_ = args_7->field_0x2;
  closeBrace.numFlags.raw = (args_7->numFlags).raw;
  closeBrace.rawLen = args_7->rawLen;
  closeBrace.info = args_7->info;
  openBrace.kind = args_5->kind;
  openBrace._2_1_ = args_5->field_0x2;
  openBrace.numFlags.raw = (args_5->numFlags).raw;
  openBrace.rawLen = args_5->rawLen;
  openBrace.info = args_5->info;
  signing.kind = args_4->kind;
  signing._2_1_ = args_4->field_0x2;
  signing.numFlags.raw = (args_4->numFlags).raw;
  signing.rawLen = args_4->rawLen;
  signing.info = args_4->info;
  packed.kind = args_3->kind;
  packed._2_1_ = args_3->field_0x2;
  packed.numFlags.raw = (args_3->numFlags).raw;
  packed.rawLen = args_3->rawLen;
  packed.info = args_3->info;
  slang::syntax::StructUnionTypeSyntax::StructUnionTypeSyntax
            (this_00,*args,keyword,tagged,packed,signing,openBrace,args_6,closeBrace,args_8);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }